

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

uint LZ4_count(BYTE *pIn,BYTE *pMatch,BYTE *pInLimit)

{
  U16 UVar1;
  U16 UVar2;
  uint uVar3;
  U32 UVar4;
  U32 UVar5;
  size_t sVar6;
  size_t sVar7;
  size_t diff;
  BYTE *pStart;
  BYTE *pInLimit_local;
  BYTE *pMatch_local;
  BYTE *pIn_local;
  
  pInLimit_local = pMatch;
  pMatch_local = pIn;
  while( true ) {
    if (pInLimit + -7 <= pMatch_local) {
      uVar3 = LZ4_64bits();
      if ((uVar3 != 0) && (pMatch_local < pInLimit + -3)) {
        UVar4 = LZ4_read32(pInLimit_local);
        UVar5 = LZ4_read32(pMatch_local);
        if (UVar4 == UVar5) {
          pMatch_local = pMatch_local + 4;
          pInLimit_local = pInLimit_local + 4;
        }
      }
      if (pMatch_local < pInLimit + -1) {
        UVar1 = LZ4_read16(pInLimit_local);
        UVar2 = LZ4_read16(pMatch_local);
        if (UVar1 == UVar2) {
          pMatch_local = pMatch_local + 2;
          pInLimit_local = pInLimit_local + 2;
        }
      }
      if ((pMatch_local < pInLimit) && (*pInLimit_local == *pMatch_local)) {
        pMatch_local = pMatch_local + 1;
      }
      return (int)pMatch_local - (int)pIn;
    }
    sVar6 = LZ4_read_ARCH(pInLimit_local);
    sVar7 = LZ4_read_ARCH(pMatch_local);
    if ((sVar6 ^ sVar7) != 0) break;
    pMatch_local = pMatch_local + 8;
    pInLimit_local = pInLimit_local + 8;
  }
  uVar3 = LZ4_NbCommonBytes(sVar6 ^ sVar7);
  return ((int)pMatch_local + uVar3) - (int)pIn;
}

Assistant:

static unsigned LZ4_count(const BYTE* pIn, const BYTE* pMatch, const BYTE* pInLimit)
{
    const BYTE* const pStart = pIn;

    while (likely(pIn<pInLimit-(STEPSIZE-1)))
    {
        size_t diff = LZ4_read_ARCH(pMatch) ^ LZ4_read_ARCH(pIn);
        if (!diff) { pIn+=STEPSIZE; pMatch+=STEPSIZE; continue; }
        pIn += LZ4_NbCommonBytes(diff);
        return (unsigned)(pIn - pStart);
    }

    if (LZ4_64bits()) if ((pIn<(pInLimit-3)) && (LZ4_read32(pMatch) == LZ4_read32(pIn))) { pIn+=4; pMatch+=4; }
    if ((pIn<(pInLimit-1)) && (LZ4_read16(pMatch) == LZ4_read16(pIn))) { pIn+=2; pMatch+=2; }
    if ((pIn<pInLimit) && (*pMatch == *pIn)) pIn++;
    return (unsigned)(pIn - pStart);
}